

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O3

void CheckPut(void *ptr,char *k,size_t klen,char *v,size_t vlen)

{
  int iVar1;
  size_t extraout_RAX;
  size_t n;
  char *expected;
  char *pcVar2;
  char *expected_00;
  size_t sStack_58;
  
  iVar1 = *ptr;
  if (1 < iVar1) {
    CheckPut_cold_1();
    if (*(int *)&((leveldb_iterator_t *)ptr)->rep == 2) {
      CheckEqual("bar",k,n);
      *(int *)&((leveldb_iterator_t *)ptr)->rep = *(int *)&((leveldb_iterator_t *)ptr)->rep + 1;
      return;
    }
    CheckDel_cold_1();
    sStack_58 = extraout_RAX;
    pcVar2 = leveldb_iter_key((leveldb_iterator_t *)ptr,&sStack_58);
    CheckEqual(k,pcVar2,sStack_58);
    pcVar2 = leveldb_iter_value((leveldb_iterator_t *)ptr,&sStack_58);
    CheckEqual(expected,pcVar2,sStack_58);
    return;
  }
  if (iVar1 == 0) {
    expected_00 = "b";
    pcVar2 = "bar";
  }
  else {
    if (iVar1 != 1) goto LAB_00108664;
    expected_00 = "c";
    pcVar2 = "box";
  }
  CheckEqual(pcVar2,k,klen);
  CheckEqual(expected_00,v,vlen);
LAB_00108664:
  *(int *)ptr = *ptr + 1;
  return;
}

Assistant:

static void CheckPut(void* ptr,
                     const char* k, size_t klen,
                     const char* v, size_t vlen) {
  int* state = (int*) ptr;
  CheckCondition(*state < 2);
  switch (*state) {
    case 0:
      CheckEqual("bar", k, klen);
      CheckEqual("b", v, vlen);
      break;
    case 1:
      CheckEqual("box", k, klen);
      CheckEqual("c", v, vlen);
      break;
  }
  (*state)++;
}